

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Stress::anon_unknown_0::LongShaderGenerator::addLine
          (LongShaderGenerator *this,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *text_local;
  LongShaderGenerator *this_local;
  
  local_18 = text;
  text_local = (string *)this;
  addIndent(this);
  std::operator+(&local_38,local_18,"\n");
  std::__cxx11::string::operator+=((string *)&this->m_source,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void LongShaderGenerator::addLine (const std::string& text)
{
	addIndent();
	m_source += text + "\n";
}